

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_embedded_file.cpp
# Opt level: O2

bool __thiscall ON_EmbeddedFile::LoadFromBuffer(ON_EmbeddedFile *this,ON_Buffer *buf)

{
  CImpl *pCVar1;
  ON__UINT64 OVar2;
  ON__UINT64 OVar3;
  
  (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[0x21])();
  pCVar1 = this->m_impl;
  CImpl::Data::SetLength(&pCVar1->m_data,buf->m_buffer_size);
  OVar3 = ON_Buffer::Read(buf,(pCVar1->m_data).m_length,
                          (pCVar1->m_data).m_buffer._M_t.
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl);
  OVar2 = (pCVar1->m_data).m_length;
  if (OVar3 != OVar2) {
    (this->m_impl->m_data).m_error = true;
  }
  return OVar3 == OVar2;
}

Assistant:

bool ON_EmbeddedFile::LoadFromBuffer(ON_Buffer& buf)
{
  Clear();

  // Allocate a buffer for the data.
  auto& d = m_impl->m_data;
  d.SetLength(size_t(buf.Size()));

  // Load the buffer from 'buf'.
  if (buf.Read(d.m_length, d.m_buffer.get()) == d.m_length)
    return true;

  m_impl->m_data.m_error = true;

  return false;
}